

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonparser.cpp
# Opt level: O0

ParsedJson * build_parsed_json(uint8_t *buf,size_t len,bool reallocifneeded)

{
  bool bVar1;
  bool bVar2;
  ostream *this;
  size_t in_RDX;
  size_t in_RSI;
  ParsedJson *in_RDI;
  bool ok;
  ParsedJson *pj;
  ParsedJson *pj_00;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  uint8_t *in_stack_ffffffffffffffd8;
  ParsedJson *this_00;
  
  pj_00 = in_RDI;
  this_00 = in_RDI;
  ParsedJson::ParsedJson(in_RDI);
  bVar1 = ParsedJson::allocateCapacity(this_00,in_RSI,in_RDX);
  if (bVar1) {
    bVar1 = json_parse(in_stack_ffffffffffffffd8,
                       CONCAT44(in_stack_ffffffffffffffd4,
                                CONCAT13(bVar1,(int3)in_stack_ffffffffffffffd0)),pj_00,
                       SUB81((ulong)in_RDI >> 0x38,0));
    bVar2 = ParsedJson::isValid(pj_00);
    if (bVar1 != bVar2) {
      __assert_fail("ok == pj.isValid()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Gian99Santos[P]simdjson/src/jsonparser.cpp"
                    ,0x3e,"ParsedJson build_parsed_json(const uint8_t *, size_t, bool)");
    }
  }
  else {
    this = std::operator<<((ostream *)&std::cerr,"failure during memory allocation ");
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  }
  return in_RDI;
}

Assistant:

WARN_UNUSED
ParsedJson build_parsed_json(const uint8_t *buf, size_t len, bool reallocifneeded) {
  ParsedJson pj;
  bool ok = pj.allocateCapacity(len);
  if(ok) {
    ok = json_parse(buf, len, pj, reallocifneeded);
    assert(ok == pj.isValid());
  } else {
    std::cerr << "failure during memory allocation " << std::endl;
  }
  return pj;
}